

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

uchar duckdb::Cast::Operation<signed_char,unsigned_char>(char input)

{
  bool bVar1;
  InvalidInputException *this;
  uchar result;
  char in_stack_000001af;
  string *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  uchar local_2;
  
  bVar1 = TryCast::Operation<signed_char,unsigned_char>
                    ((int8_t)((ulong)in_stack_ffffffffffffffc0 >> 0x38),
                     (uint8_t *)in_stack_ffffffffffffffb8,false);
  if (!bVar1) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<signed_char,unsigned_char>(in_stack_000001af);
    InvalidInputException::InvalidInputException(this,in_stack_ffffffffffffffb8);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return local_2;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}